

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20240722::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__2,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  undefined8 *puVar1;
  AlphaNum local_68;
  AlphaNum local_38;
  
  local_38.piece_._M_len = 0x1e;
  local_38.piece_._M_str = "Couldn\'t parse default value \"";
  puVar1 = (undefined8 *)(*(ulong *)(*(long *)this + 0x30) & 0xfffffffffffffffc);
  local_68.piece_._M_str = (char *)*puVar1;
  local_68.piece_._M_len = puVar1[1];
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_38,&local_68);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}